

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O1

void fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(uint64_t *out1,uint64_t *arg1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint64_t x2;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *arg1;
  uVar17 = *arg1 * -0x1bc;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar17;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = arg1[1];
  uVar18 = SUB168(ZEXT816(0xc084) * auVar10,0);
  uVar22 = SUB168(auVar2 * ZEXT816(0x6f),8) + SUB168(auVar1 * ZEXT816(0xc084),8) +
           (ulong)CARRY8(SUB168(auVar2 * ZEXT816(0x6f),0),SUB168(auVar1 * ZEXT816(0xc084),0));
  uVar23 = uVar22 + uVar18;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar23 * 0x4e6a171024e6a171;
  uVar19 = uVar17 >> 1 | uVar23 << 0x3f;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = arg1[2];
  uVar17 = SUB168(ZEXT816(0xc084) * auVar11,0);
  uVar22 = SUB168(auVar3 * ZEXT816(0x6f),8) +
           SUB168(ZEXT816(0xc084) * auVar10,8) + (ulong)CARRY8(uVar22,uVar18) +
           (ulong)CARRY8(SUB168(auVar3 * ZEXT816(0x6f),0),uVar23);
  uVar20 = uVar22 + uVar17;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar20 * 0x4e6a171024e6a171;
  uVar30 = uVar23 * 0x4e6a171024e6a171 >> 1 | uVar20 << 0x3f;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = arg1[3];
  uVar18 = SUB168(ZEXT816(0xc084) * auVar12,0);
  uVar22 = SUB168(auVar4 * ZEXT816(0x6f),8) +
           SUB168(ZEXT816(0xc084) * auVar11,8) + (ulong)CARRY8(uVar22,uVar17) +
           (ulong)CARRY8(SUB168(auVar4 * ZEXT816(0x6f),0),uVar20);
  uVar23 = uVar22 + uVar18;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar23 * 0x4e6a171024e6a171;
  uVar28 = uVar20 * 0x4e6a171024e6a171 >> 1 | uVar23 << 0x3f;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = arg1[4];
  uVar17 = SUB168(ZEXT816(0xc084) * auVar13,0);
  uVar22 = SUB168(auVar5 * ZEXT816(0x6f),8) +
           SUB168(ZEXT816(0xc084) * auVar12,8) + (ulong)CARRY8(uVar22,uVar18) +
           (ulong)CARRY8(SUB168(auVar5 * ZEXT816(0x6f),0),uVar23);
  uVar20 = uVar22 + uVar17;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar20 * 0x4e6a171024e6a171;
  uVar21 = uVar23 * 0x4e6a171024e6a171 >> 1 | uVar20 << 0x3f;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = arg1[5];
  uVar18 = SUB168(ZEXT816(0xc084) * auVar14,0);
  uVar22 = SUB168(auVar6 * ZEXT816(0x6f),8) +
           SUB168(ZEXT816(0xc084) * auVar13,8) + (ulong)CARRY8(uVar22,uVar17) +
           (ulong)CARRY8(SUB168(auVar6 * ZEXT816(0x6f),0),uVar20);
  uVar23 = uVar22 + uVar18;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar23 * 0x4e6a171024e6a171;
  uVar24 = uVar20 * 0x4e6a171024e6a171 >> 1 | uVar23 << 0x3f;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = arg1[6];
  uVar17 = SUB168(ZEXT816(0xc084) * auVar15,0);
  uVar18 = SUB168(auVar7 * ZEXT816(0x6f),8) +
           SUB168(ZEXT816(0xc084) * auVar14,8) + (ulong)CARRY8(uVar22,uVar18) +
           (ulong)CARRY8(SUB168(auVar7 * ZEXT816(0x6f),0),uVar23);
  uVar25 = uVar18 + uVar17;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar25 * 0x4e6a171024e6a171;
  uVar18 = SUB168(auVar8 * ZEXT816(0x6f),8) +
           SUB168(ZEXT816(0xc084) * auVar15,8) + (ulong)CARRY8(uVar18,uVar17) +
           (ulong)CARRY8(SUB168(auVar8 * ZEXT816(0x6f),0),uVar25);
  uVar26 = uVar25 << 0x3f | uVar23 * 0x4e6a171024e6a171 >> 1;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = arg1[7];
  uVar22 = SUB168(ZEXT816(0xc084) * auVar16,8);
  uVar17 = SUB168(ZEXT816(0xc084) * auVar16,0);
  uVar34 = uVar17 + uVar18;
  uVar17 = (ulong)CARRY8(uVar17,uVar18);
  uVar18 = uVar22 + uVar19;
  uVar23 = uVar18 + uVar17;
  uVar17 = (ulong)(CARRY8(uVar22,uVar19) || CARRY8(uVar18,uVar17));
  uVar32 = uVar30 + uVar17;
  uVar17 = (ulong)CARRY8(uVar30,uVar17);
  uVar20 = uVar28 + uVar17;
  uVar17 = (ulong)CARRY8(uVar28,uVar17);
  uVar28 = uVar21 + uVar17;
  uVar17 = (ulong)CARRY8(uVar21,uVar17);
  uVar21 = uVar24 + uVar17;
  uVar17 = (ulong)CARRY8(uVar24,uVar17);
  uVar24 = uVar26 + uVar17;
  uVar22 = (uVar25 * 0x4e6a171024e6a171 >> 1) + (ulong)CARRY8(uVar26,uVar17);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar34 * 0x4e6a171024e6a171;
  uVar19 = SUB168(auVar9 * ZEXT816(0x6f),8);
  uVar17 = (ulong)CARRY8(SUB168(auVar9 * ZEXT816(0x6f),0),uVar34);
  uVar18 = uVar19 + uVar23;
  uVar29 = uVar18 + uVar17;
  uVar17 = (ulong)(CARRY8(uVar19,uVar23) || CARRY8(uVar18,uVar17));
  uVar33 = uVar32 + uVar17;
  uVar17 = (ulong)CARRY8(uVar32,uVar17);
  uVar26 = uVar20 + uVar17;
  uVar17 = (ulong)CARRY8(uVar20,uVar17);
  uVar31 = uVar28 + uVar17;
  uVar17 = (ulong)CARRY8(uVar28,uVar17);
  uVar32 = uVar21 + uVar17;
  uVar17 = (ulong)CARRY8(uVar21,uVar17);
  uVar27 = uVar24 + uVar17;
  uVar17 = (ulong)CARRY8(uVar24,uVar17);
  uVar18 = (uVar34 << 0x3f) + uVar22;
  uVar30 = uVar18 + uVar17;
  uVar28 = (uVar34 * 0x4e6a171024e6a171 >> 1) +
           (ulong)(CARRY8(uVar34 << 0x3f,uVar22) || CARRY8(uVar18,uVar17));
  uVar18 = (ulong)(byte)-((0x6e < uVar29) + -1);
  uVar22 = (ulong)(uVar33 < uVar18);
  uVar19 = (ulong)(uVar26 < uVar22);
  uVar20 = (ulong)(uVar31 < uVar19);
  uVar23 = (ulong)(uVar32 < uVar20);
  uVar21 = (ulong)(uVar27 < uVar23);
  uVar24 = (ulong)(uVar30 < uVar21) | 0x8000000000000000;
  uVar17 = -(ulong)(uVar28 < uVar24);
  uVar25 = ~uVar17;
  *out1 = uVar29 - 0x6f & uVar25 | uVar29 & uVar17;
  out1[1] = uVar33 - uVar18 & uVar25 | uVar33 & uVar17;
  out1[2] = uVar26 - uVar22 & uVar25 | uVar26 & uVar17;
  out1[3] = uVar31 - uVar19 & uVar25 | uVar31 & uVar17;
  out1[4] = uVar32 - uVar20 & uVar25 | uVar32 & uVar17;
  out1[5] = uVar27 - uVar23 & uVar25 | uVar27 & uVar17;
  out1[6] = uVar30 - uVar21 & uVar25 | uVar30 & uVar17;
  out1[7] = uVar25 & uVar28 - uVar24 | uVar17 & uVar28;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(
    uint64_t out1[8], const uint64_t arg1[8]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x12;
    uint64_t x13;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x14;
    uint64_t x15;
    uint64_t x16;
    uint64_t x17;
    uint64_t x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x26;
    uint64_t x27;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x28;
    uint64_t x29;
    uint64_t x30;
    uint64_t x31;
    uint64_t x32;
    uint64_t x33;
    uint64_t x34;
    uint64_t x35;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x40;
    uint64_t x41;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x42;
    uint64_t x43;
    uint64_t x44;
    uint64_t x45;
    uint64_t x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x54;
    uint64_t x55;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x56;
    uint64_t x57;
    uint64_t x58;
    uint64_t x59;
    uint64_t x60;
    uint64_t x61;
    uint64_t x62;
    uint64_t x63;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x64;
    uint64_t x65;
    uint64_t x66;
    uint64_t x67;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x68;
    uint64_t x69;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x70;
    uint64_t x71;
    uint64_t x72;
    uint64_t x73;
    uint64_t x74;
    uint64_t x75;
    uint64_t x76;
    uint64_t x77;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x78;
    uint64_t x79;
    uint64_t x80;
    uint64_t x81;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x82;
    uint64_t x83;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x84;
    uint64_t x85;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x86;
    uint64_t x87;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x88;
    uint64_t x89;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x90;
    uint64_t x91;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x92;
    uint64_t x93;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x94;
    uint64_t x95;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x96;
    uint64_t x97;
    uint64_t x98;
    uint64_t x99;
    uint64_t x100;
    uint64_t x101;
    uint64_t x102;
    uint64_t x103;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x104;
    uint64_t x105;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x106;
    uint64_t x107;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x108;
    uint64_t x109;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x110;
    uint64_t x111;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x112;
    uint64_t x113;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x114;
    uint64_t x115;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x116;
    uint64_t x117;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x118;
    uint64_t x119;
    uint64_t x120;
    uint64_t x121;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x122;
    uint64_t x123;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x124;
    uint64_t x125;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x126;
    uint64_t x127;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x128;
    uint64_t x129;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x130;
    uint64_t x131;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x132;
    uint64_t x133;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x134;
    uint64_t x135;
    uint64_t x136;
    uint64_t x137;
    uint64_t x138;
    uint64_t x139;
    uint64_t x140;
    uint64_t x141;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x142;
    uint64_t x143;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x144;
    uint64_t x145;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x146;
    uint64_t x147;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x148;
    uint64_t x149;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x150;
    uint64_t x151;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x152;
    uint64_t x153;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x154;
    uint64_t x155;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x156;
    uint64_t x157;
    uint64_t x158;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x159;
    uint64_t x160;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x161;
    uint64_t x162;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x163;
    uint64_t x164;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x165;
    uint64_t x166;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x167;
    uint64_t x168;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x169;
    uint64_t x170;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x171;
    uint64_t x172;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x173;
    uint64_t x174;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x175;
    uint64_t x176;
    uint64_t x177;
    uint64_t x178;
    uint64_t x179;
    uint64_t x180;
    uint64_t x181;
    uint64_t x182;
    uint64_t x183;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x1, &x2, (arg1[0]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x3, &x4, x1, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x5, &x6, x3, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x7, &x8, x3,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x9, &x10, (arg1[1]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x11, &x12, 0x0, x1,
                                                            x7);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x13, &x14, 0x0, ((x12 + x2) + x8), x9);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x15, &x16, x13, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x17, &x18, x15, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x19, &x20, x15,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x21, &x22, 0x0, x6,
                                                            x17);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x23, &x24, (arg1[2]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x25, &x26, 0x0,
                                                            x13, x19);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x27, &x28, 0x0, ((x26 + (x14 + x10)) + x20), x23);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x29, &x30, x27, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x31, &x32, x29, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x33, &x34, x29,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x35, &x36, 0x0,
                                                            (x22 + x18), x31);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x37, &x38, (arg1[3]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x39, &x40, 0x0,
                                                            x27, x33);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x41, &x42, 0x0, ((x40 + (x28 + x24)) + x34), x37);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x43, &x44, x41, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x45, &x46, x43, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x47, &x48, x43,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x49, &x50, 0x0,
                                                            (x36 + x32), x45);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x51, &x52, (arg1[4]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x53, &x54, 0x0,
                                                            x41, x47);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x55, &x56, 0x0, ((x54 + (x42 + x38)) + x48), x51);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x57, &x58, x55, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x59, &x60, x57, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x61, &x62, x57,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x63, &x64, 0x0,
                                                            (x50 + x46), x59);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x65, &x66, (arg1[5]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x67, &x68, 0x0,
                                                            x55, x61);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x69, &x70, 0x0, ((x68 + (x56 + x52)) + x62), x65);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x71, &x72, x69, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x73, &x74, x71, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x75, &x76, x71,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x77, &x78, 0x0,
                                                            (x64 + x60), x73);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x79, &x80, (arg1[6]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x81, &x82, 0x0,
                                                            x69, x75);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x83, &x84, 0x0, ((x82 + (x70 + x66)) + x76), x79);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x85, &x86, x84, x5,
                                                            x80);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x87, &x88, x86,
                                                            x21, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x89, &x90, x88,
                                                            x35, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x91, &x92, x90,
                                                            x49, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x93, &x94, x92,
                                                            x63, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x95, &x96, x94,
                                                            x77, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x97, &x98, x83, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x99, &x100, x97, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x101, &x102, x97,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x103, &x104, 0x0,
                                                            x83, x101);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x105, &x106, x104,
                                                            x85, x102);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x107, &x108, x106,
                                                            x87, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x109, &x110, x108,
                                                            x89, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x111, &x112, x110,
                                                            x91, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x113, &x114, x112,
                                                            x93, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x115, &x116, x114,
                                                            x95, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x117, &x118, x116, (x96 + (x78 + x74)), x99);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x119, &x120, (arg1[7]),
                                                       UINT16_C(0xc084));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x121, &x122, 0x0,
                                                            x105, x119);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x123, &x124, x122,
                                                            x107, x120);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x125, &x126, x124,
                                                            x109, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x127, &x128, x126,
                                                            x111, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x129, &x130, x128,
                                                            x113, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x131, &x132, x130,
                                                            x115, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x133, &x134, x132,
                                                            x117, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x135, &x136, x121, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x137, &x138, x135, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x139, &x140, x135,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x141, &x142, 0x0,
                                                            x121, x139);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x143, &x144, x142,
                                                            x123, x140);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x145, &x146, x144,
                                                            x125, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x147, &x148, x146,
                                                            x127, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x149, &x150, x148,
                                                            x129, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x151, &x152, x150,
                                                            x131, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x153, &x154, x152,
                                                            x133, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x155, &x156, x154, (x134 + (x118 + x100)), x137);
    x157 = (x156 + x138);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(
        &x158, &x159, 0x0, x143, UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x160, &x161, x159,
                                                             x145, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x162, &x163, x161,
                                                             x147, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x164, &x165, x163,
                                                             x149, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x166, &x167, x165,
                                                             x151, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x168, &x169, x167,
                                                             x153, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x170, &x171, x169,
                                                             x155, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(
        &x172, &x173, x171, x157, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x174, &x175, x173,
                                                             0x0, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x176, x175, x158,
                                                          x143);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x177, x175, x160,
                                                          x145);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x178, x175, x162,
                                                          x147);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x179, x175, x164,
                                                          x149);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x180, x175, x166,
                                                          x151);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x181, x175, x168,
                                                          x153);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x182, x175, x170,
                                                          x155);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x183, x175, x172,
                                                          x157);
    out1[0] = x176;
    out1[1] = x177;
    out1[2] = x178;
    out1[3] = x179;
    out1[4] = x180;
    out1[5] = x181;
    out1[6] = x182;
    out1[7] = x183;
}